

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_hsort_is_sorted(uchar *elements,size_t n,size_t len)

{
  byte bVar1;
  uchar *puVar2;
  size_t sVar3;
  int iVar4;
  size_t sVar5;
  uchar auStack_60 [32];
  ulong uStack_40;
  
  if (1 < n) {
    puVar2 = elements + len;
    sVar3 = 1;
    do {
      if (len != 0) {
        sVar5 = 0;
        do {
          bVar1 = *(byte *)((long)((secp256k1_fe *)elements)->n + sVar5);
          iVar4 = (uint)bVar1 - (uint)puVar2[sVar5];
          if (bVar1 != puVar2[sVar5]) goto LAB_00163261;
          sVar5 = sVar5 + 1;
        } while (sVar5 != len);
        iVar4 = 0;
LAB_00163261:
        if (0 < iVar4) {
          test_hsort_is_sorted_cold_1();
          uStack_40 = (ulong)bVar1;
          while( true ) {
            testrand256(auStack_60);
            secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)elements,auStack_60);
            if (((secp256k1_fe *)elements)->n[0] < 0xffffefffffc2f) {
              return;
            }
            if (((secp256k1_fe *)elements)->n[4] != 0xffffffffffff) break;
            if ((((secp256k1_fe *)elements)->n[2] & ((secp256k1_fe *)elements)->n[3] &
                ((secp256k1_fe *)elements)->n[1]) != 0xfffffffffffff) {
              return;
            }
          }
          return;
        }
      }
      sVar3 = sVar3 + 1;
      puVar2 = puVar2 + len;
      elements = (uchar *)((long)((secp256k1_fe *)elements)->n + len);
    } while (sVar3 != n);
  }
  return;
}

Assistant:

static void test_hsort_is_sorted(unsigned char *elements, size_t n, size_t len) {
    size_t i;
    for (i = 1; i < n; i++) {
        CHECK(secp256k1_memcmp_var(&elements[(i-1) * len], &elements[i * len], len) <= 0);
    }
}